

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns_Switch.c
# Opt level: O2

int fS(int Ns,sunrealtype t,N_Vector y,N_Vector ydot,int iS,N_Vector yS,N_Vector ySdot,void *udata,
      N_Vector tmp1,N_Vector tmp2)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pdVar1 = *(double **)((long)y->content + 0x10);
  dVar6 = pdVar1[1];
  pdVar2 = *(double **)((long)yS->content + 0x10);
  dVar4 = *(double *)((long)udata + 0x18) * dVar6 * pdVar2[2] +
          (*(double *)((long)udata + 0x18) * pdVar1[2] * pdVar2[1] -
          *(double *)((long)udata + 0x10) * *pdVar2);
  dVar3 = (*(double *)((long)udata + 0x20) + *(double *)((long)udata + 0x20)) * dVar6 * pdVar2[1];
  dVar5 = -dVar4 - dVar3;
  if (iS == 2) {
    dVar5 = dVar5 - dVar6 * dVar6;
    dVar3 = dVar3 + dVar6 * dVar6;
  }
  else if (iS == 1) {
    dVar6 = dVar6 * pdVar1[2];
    dVar4 = dVar4 + dVar6;
    dVar5 = dVar5 - dVar6;
  }
  else if (iS == 0) {
    dVar4 = dVar4 - *pdVar1;
    dVar5 = dVar5 + *pdVar1;
  }
  pdVar1 = *(double **)((long)ySdot->content + 0x10);
  *pdVar1 = dVar4;
  pdVar1[1] = dVar5;
  pdVar1[2] = dVar3;
  return 0;
}

Assistant:

static int fS(int Ns, sunrealtype t, N_Vector y, N_Vector ydot, int iS,
              N_Vector yS, N_Vector ySdot, void* udata, N_Vector tmp1,
              N_Vector tmp2)
{
  UserData data;
  sunrealtype p1, p2, p3;
  sunrealtype y1, y2, y3;
  sunrealtype s1, s2, s3;
  sunrealtype sd1, sd2, sd3;

  data = (UserData)udata;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  y1 = NV_Ith_S(y, 0);
  y2 = NV_Ith_S(y, 1);
  y3 = NV_Ith_S(y, 2);
  s1 = NV_Ith_S(yS, 0);
  s2 = NV_Ith_S(yS, 1);
  s3 = NV_Ith_S(yS, 2);

  sd1 = -p1 * s1 + p2 * y3 * s2 + p2 * y2 * s3;
  sd3 = 2 * p3 * y2 * s2;
  sd2 = -sd1 - sd3;

  switch (iS)
  {
  case 0:
    sd1 += -y1;
    sd2 += y1;
    break;
  case 1:
    sd1 += y2 * y3;
    sd2 += -y2 * y3;
    break;
  case 2:
    sd2 += -y2 * y2;
    sd3 += y2 * y2;
    break;
  }

  NV_Ith_S(ySdot, 0) = sd1;
  NV_Ith_S(ySdot, 1) = sd2;
  NV_Ith_S(ySdot, 2) = sd3;

  return (0);
}